

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

DayOfWeek __thiscall QLocale::firstDayOfWeek(QLocale *this)

{
  bool bVar1;
  QSystemLocale *pQVar2;
  QLocaleData *pQVar3;
  DayOfWeek unaff_EBP;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined8 local_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = ((this->d).d.ptr)->m_data;
  if (pQVar3 == &systemLocaleData) {
    local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = systemLocale();
    local_68._16_8_ = 0;
    local_68.shared = (PrivateShared *)0x0;
    local_68._8_8_ = 0;
    local_50 = 2;
    (*pQVar2->_vptr_QSystemLocale[2])(&local_48,pQVar2,0x1d);
    ::QVariant::~QVariant((QVariant *)&local_68);
    bVar1 = ::QVariant::isNull((QVariant *)&local_48);
    if (!bVar1) {
      unaff_EBP = ::QVariant::toUInt((QVariant *)&local_48,(bool *)0x0);
    }
    ::QVariant::~QVariant((QVariant *)&local_48);
    if (!bVar1) goto LAB_002ddcac;
    pQVar3 = ((this->d).d.ptr)->m_data;
  }
  unaff_EBP = *(uint *)&pQVar3->field_0x78 >> 5 & Sunday;
LAB_002ddcac:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return unaff_EBP;
  }
  __stack_chk_fail();
}

Assistant:

Qt::DayOfWeek QLocale::firstDayOfWeek() const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        const auto res = systemLocale()->query(QSystemLocale::FirstDayOfWeek);
        if (!res.isNull())
            return static_cast<Qt::DayOfWeek>(res.toUInt());
    }
#endif
    return static_cast<Qt::DayOfWeek>(d->m_data->m_first_day_of_week);
}